

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App_inl.hpp
# Opt level: O1

bool __thiscall CLI::App::_parse_single_config(App *this,ConfigItem *item,size_t level)

{
  string *__rhs;
  pointer *pppAVar1;
  pointer pcVar2;
  iterator __position;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  element_type *peVar4;
  pointer pbVar5;
  pointer ppVar6;
  pointer ppVar7;
  size_t sVar8;
  size_t __n;
  string *psVar9;
  pointer *ppbVar10;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar11;
  bool bVar12;
  type_conflict tVar13;
  int iVar14;
  App *pAVar15;
  Option *this_00;
  Option *pOVar16;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __first;
  int64_t iVar17;
  InvalidError *this_01;
  int *piVar18;
  ConfigError *__return_storage_ptr__;
  ArgumentMismatch *__return_storage_ptr___00;
  ConversionError *__return_storage_ptr___01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *input;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__args_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__x;
  _Alloc_hider _Var19;
  pointer pbVar20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *str;
  results_t *prVar21;
  pointer ppVar22;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar23;
  bool bVar24;
  string res;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  buffer;
  string local_2b0;
  results_t *local_290;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_288;
  pointer local_270;
  string local_268;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_248;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  pbVar20 = (item->parents).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (level < (ulong)((long)(item->parents).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar20 >> 5)) {
    _Var19._M_p = pbVar20[level]._M_dataplus._M_p;
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,_Var19._M_p,_Var19._M_p + pbVar20[level]._M_string_length);
    pAVar15 = _find_subcommand(this,&local_50,false,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    if (pAVar15 == (App *)0x0) {
      return false;
    }
    bVar12 = _parse_single_config(pAVar15,item,level + 1);
    return bVar12;
  }
  __rhs = &item->name;
  iVar14 = ::std::__cxx11::string::compare((char *)__rhs);
  if (iVar14 == 0) {
    if (this->configurable_ != true) {
      return true;
    }
    increment_parsed(this);
    _trigger_pre_parse(this,2);
    pAVar15 = this->parent_;
    if (pAVar15 != (App *)0x0) {
      __position._M_current =
           (pAVar15->parsed_subcommands_).
           super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (pAVar15->parsed_subcommands_).super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        local_2b0._M_dataplus._M_p = (pointer)this;
        ::std::vector<CLI::App*,std::allocator<CLI::App*>>::_M_realloc_insert<CLI::App*>
                  ((vector<CLI::App*,std::allocator<CLI::App*>> *)&pAVar15->parsed_subcommands_,
                   __position,(App **)&local_2b0);
        return true;
      }
      *__position._M_current = this;
      pppAVar1 = &(pAVar15->parsed_subcommands_).
                  super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      *pppAVar1 = *pppAVar1 + 1;
      return true;
    }
    return true;
  }
  iVar14 = ::std::__cxx11::string::compare((char *)__rhs);
  if (iVar14 == 0) {
    if (this->configurable_ != true) {
      return true;
    }
    if ((this->parse_complete_callback_).super__Function_base._M_manager != (_Manager_type)0x0) {
      _process_callbacks(this);
      _process_requirements(this);
      run_callback(this,false,false);
      return true;
    }
    return true;
  }
  ::std::operator+(&local_70,"--",__rhs);
  this_00 = get_option_no_throw(this,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if (this_00 == (Option *)0x0) {
    if ((item->name)._M_string_length == 1) {
      ::std::operator+(&local_90,"-",__rhs);
      this_00 = get_option_no_throw(this,&local_90);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p);
      }
    }
    else {
      this_00 = (Option *)0x0;
    }
    if (this_00 == (Option *)0x0) {
      pcVar2 = (item->name)._M_dataplus._M_p;
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_b0,pcVar2,pcVar2 + (item->name)._M_string_length);
      this_00 = get_option_no_throw(this,&local_b0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p);
      }
    }
    else if ((this_00->super_OptionBase<CLI::Option>).configurable_ == false) {
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
      pcVar2 = (item->name)._M_dataplus._M_p;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_f0,pcVar2,pcVar2 + (item->name)._M_string_length);
      pOVar16 = get_option_no_throw(this,&local_f0);
      psVar9 = &local_f0;
      _Var19._M_p = local_f0._M_dataplus._M_p;
      goto LAB_0012a49d;
    }
  }
  else if ((this_00->super_OptionBase<CLI::Option>).configurable_ == false) {
    if ((item->name)._M_string_length == 1) {
      ::std::operator+(&local_d0,"-",__rhs);
      pOVar16 = get_option_no_throw(this,&local_d0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p);
      }
      if ((pOVar16 != (Option *)0x0) &&
         ((pOVar16->super_OptionBase<CLI::Option>).configurable_ != false)) {
        this_00 = pOVar16;
      }
    }
    if ((this_00->super_OptionBase<CLI::Option>).configurable_ == false) {
      local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
      pcVar2 = (item->name)._M_dataplus._M_p;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_110,pcVar2,pcVar2 + (item->name)._M_string_length);
      pOVar16 = get_option_no_throw(this,&local_110);
      psVar9 = &local_110;
      _Var19._M_p = local_110._M_dataplus._M_p;
LAB_0012a49d:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var19._M_p != &psVar9->field_2) {
        operator_delete(_Var19._M_p);
      }
      if ((pOVar16 != (Option *)0x0) &&
         ((pOVar16->super_OptionBase<CLI::Option>).configurable_ != false)) {
        this_00 = pOVar16;
      }
    }
  }
  if (this_00 == (Option *)0x0) {
    if (this->allow_config_extras_ == capture) {
      local_268._M_dataplus._M_p._0_1_ = 0;
      ConfigItem::fullname_abi_cxx11_(&local_2b0,item);
      ::std::
      vector<std::pair<CLI::detail::Classifier,std::__cxx11::string>,std::allocator<std::pair<CLI::detail::Classifier,std::__cxx11::string>>>
      ::emplace_back<CLI::detail::Classifier,std::__cxx11::string>
                ((vector<std::pair<CLI::detail::Classifier,std::__cxx11::string>,std::allocator<std::pair<CLI::detail::Classifier,std::__cxx11::string>>>
                  *)&this->missing_,(Classifier *)&local_268,&local_2b0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
        operator_delete(local_2b0._M_dataplus._M_p);
      }
      __args_1 = (item->inputs).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      pbVar3 = (item->inputs).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (__args_1 != pbVar3) {
        do {
          local_2b0._M_dataplus._M_p = local_2b0._M_dataplus._M_p & 0xffffffffffffff00;
          ::std::
          vector<std::pair<CLI::detail::Classifier,std::__cxx11::string>,std::allocator<std::pair<CLI::detail::Classifier,std::__cxx11::string>>>
          ::emplace_back<CLI::detail::Classifier,std::__cxx11::string_const&>
                    ((vector<std::pair<CLI::detail::Classifier,std::__cxx11::string>,std::allocator<std::pair<CLI::detail::Classifier,std::__cxx11::string>>>
                      *)&this->missing_,(Classifier *)&local_2b0,__args_1);
          __args_1 = __args_1 + 1;
        } while (__args_1 != pbVar3);
        return false;
      }
    }
    return false;
  }
  if ((this_00->super_OptionBase<CLI::Option>).configurable_ == false) {
    if (this->allow_config_extras_ == ignore_all) {
      return false;
    }
    __return_storage_ptr__ = (ConfigError *)__cxa_allocate_exception(0x38);
    ConfigItem::fullname_abi_cxx11_(&local_130,item);
    ConfigError::NotConfigurable(__return_storage_ptr__,&local_130);
    __cxa_throw(__return_storage_ptr__,&ConfigError::typeinfo,Error::~Error);
  }
  if ((this_00->results_).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this_00->results_).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    return true;
  }
  local_288.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_288.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_288.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((item->multiline == true) && (this_00->inject_separator_ == false)) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=(&local_288,&item->inputs);
    __first = ::std::
              __remove_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<char_const[3]>>
                        ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          )local_288.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start,
                         (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          )local_288.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish,
                         (_Iter_equals_val<const_char[3]>)0x1303d4);
    bVar12 = true;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_erase(&local_288,(iterator)__first._M_current,
               (iterator)
               local_288.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  }
  else {
    bVar12 = false;
  }
  local_290 = &this_00->results_;
  __x = &local_288;
  if (!bVar12) {
    __x = &item->inputs;
  }
  if (this_00->expected_min_ == 0) {
    if ((ulong)((long)(item->inputs).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
               (long)(item->inputs).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start) < 0x21) {
      peVar4 = (this->config_formatter_).super___shared_ptr<CLI::Config,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      (*peVar4->_vptr_Config[2])(&local_2b0,peVar4,item);
      if ((this_00->super_OptionBase<CLI::Option>).disable_flag_override_ == true) {
        local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_150,local_2b0._M_dataplus._M_p,
                   local_2b0._M_dataplus._M_p + local_2b0._M_string_length);
        iVar17 = detail::to_flag_value(&local_150);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_150._M_dataplus._M_p != &local_150.field_2) {
          operator_delete(local_150._M_dataplus._M_p);
        }
        if (iVar17 != 1) goto LAB_0012a9fd;
        paVar23 = &local_1d0.field_2;
        local_1d0._M_dataplus._M_p = (pointer)paVar23;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,"{}","");
        Option::get_flag_value(&local_268,this_00,__rhs,&local_1d0);
        ::std::__cxx11::string::operator=((string *)&local_2b0,(string *)&local_268);
        _Var19._M_p = local_1d0._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_268._M_dataplus._M_p._1_7_,local_268._M_dataplus._M_p._0_1_) !=
            &local_268.field_2) {
          operator_delete((undefined1 *)
                          CONCAT71(local_268._M_dataplus._M_p._1_7_,local_268._M_dataplus._M_p._0_1_
                                  ));
          _Var19._M_p = local_1d0._M_dataplus._M_p;
        }
LAB_0012aa90:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var19._M_p != paVar23) {
          operator_delete(_Var19._M_p);
        }
      }
      else {
LAB_0012a9fd:
        piVar18 = __errno_location();
        *piVar18 = 0;
        iVar14 = ::std::__cxx11::string::compare((char *)&local_2b0);
        if ((iVar14 != 0) || (this_00->expected_max_ < 2)) {
          paVar23 = &local_1f0.field_2;
          local_1f0._M_dataplus._M_p = (pointer)paVar23;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_1f0,local_2b0._M_dataplus._M_p,
                     local_2b0._M_dataplus._M_p + local_2b0._M_string_length);
          Option::get_flag_value(&local_268,this_00,__rhs,&local_1f0);
          ::std::__cxx11::string::operator=((string *)&local_2b0,(string *)&local_268);
          _Var19._M_p = local_1f0._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT71(local_268._M_dataplus._M_p._1_7_,local_268._M_dataplus._M_p._0_1_) !=
              &local_268.field_2) {
            operator_delete((undefined1 *)
                            CONCAT71(local_268._M_dataplus._M_p._1_7_,
                                     local_268._M_dataplus._M_p._0_1_));
            _Var19._M_p = local_1f0._M_dataplus._M_p;
          }
          goto LAB_0012aa90;
        }
      }
      local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_210,local_2b0._M_dataplus._M_p,
                 local_2b0._M_dataplus._M_p + local_2b0._M_string_length);
      Option::_add_result(this_00,&local_210,local_290);
      this_00->current_option_state_ = parsing;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_210._M_dataplus._M_p != &local_210.field_2) {
        operator_delete(local_210._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
        operator_delete(local_2b0._M_dataplus._M_p);
      }
      goto LAB_0012a6a6;
    }
    pvVar11 = &local_288;
    if (!bVar12) {
      pvVar11 = &item->inputs;
    }
    ppbVar10 = &(pvVar11->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish;
    pbVar20 = *ppbVar10;
    pbVar5 = (__x->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    local_2b0._M_dataplus._M_p._0_4_ = this_00->type_size_max_;
    tVar13 = detail::checked_multiply<int>((int *)&local_2b0,this_00->expected_max_);
    iVar14 = 0x20000000;
    if (tVar13) {
      iVar14 = (int)local_2b0._M_dataplus._M_p;
    }
    if ((iVar14 < (int)((ulong)((long)pbVar20 - (long)pbVar5) >> 5)) &&
       ((this_00->super_OptionBase<CLI::Option>).multi_option_policy_ != TakeAll)) {
      local_2b0._M_dataplus._M_p._0_4_ = this_00->type_size_max_;
      tVar13 = detail::checked_multiply<int>((int *)&local_2b0,this_00->expected_max_);
      if (!tVar13 || 1 < (int)local_2b0._M_dataplus._M_p) {
        __return_storage_ptr___00 = (ArgumentMismatch *)__cxa_allocate_exception(0x38);
        ConfigItem::fullname_abi_cxx11_(&local_170,item);
        local_2b0._M_dataplus._M_p._0_4_ = this_00->type_size_max_;
        tVar13 = detail::checked_multiply<int>((int *)&local_2b0,this_00->expected_max_);
        iVar14 = 0x20000000;
        if (tVar13) {
          iVar14 = (int)local_2b0._M_dataplus._M_p;
        }
        ArgumentMismatch::AtMost
                  (__return_storage_ptr___00,&local_170,iVar14,
                   (long)*ppbVar10 -
                   (long)(__x->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start >> 5);
        __cxa_throw(__return_storage_ptr___00,&ArgumentMismatch::typeinfo,Error::~Error);
      }
      if ((this_00->super_OptionBase<CLI::Option>).disable_flag_override_ == false) {
        __return_storage_ptr___01 = (ConversionError *)__cxa_allocate_exception(0x38);
        ConfigItem::fullname_abi_cxx11_(&local_190,item);
        ConversionError::TooManyInputsFlag(__return_storage_ptr___01,&local_190);
        __cxa_throw(__return_storage_ptr___01,&ConversionError::typeinfo,Error::~Error);
      }
      pbVar20 = (__x->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      local_270 = *ppbVar10;
      prVar21 = local_290;
      if (pbVar20 != local_270) {
        do {
          ppVar6 = (this_00->default_flag_values_).
                   super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          ppVar7 = (this_00->default_flag_values_).
                   super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          if (ppVar6 == ppVar7) {
            iVar14 = ::std::__cxx11::string::compare((char *)pbVar20);
            if ((((iVar14 != 0) &&
                 (iVar14 = ::std::__cxx11::string::compare((char *)pbVar20), iVar14 != 0)) &&
                (iVar14 = ::std::__cxx11::string::compare((char *)pbVar20), iVar14 != 0)) &&
               (iVar14 = ::std::__cxx11::string::compare((char *)pbVar20), iVar14 != 0))
            goto LAB_0012a999;
          }
          else {
            sVar8 = pbVar20->_M_string_length;
            bVar12 = false;
            do {
              ppVar22 = ppVar6 + 1;
              __n = (ppVar6->second)._M_string_length;
              if (__n == sVar8) {
                if (__n == 0) {
                  bVar24 = true;
                }
                else {
                  iVar14 = bcmp((ppVar6->second)._M_dataplus._M_p,(pbVar20->_M_dataplus)._M_p,__n);
                  bVar24 = iVar14 == 0;
                }
              }
              else {
                bVar24 = false;
              }
              if (bVar24) {
                bVar12 = true;
                break;
              }
              ppVar6 = ppVar22;
            } while (ppVar22 != ppVar7);
            prVar21 = local_290;
            if (!bVar12) {
LAB_0012a999:
              this_01 = (InvalidError *)__cxa_allocate_exception(0x38);
              local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_1b0,"invalid flag argument given","");
              InvalidError::InvalidError(this_01,&local_1b0);
              __cxa_throw(this_01,&InvalidError::typeinfo,Error::~Error);
            }
          }
          pcVar2 = (pbVar20->_M_dataplus)._M_p;
          local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_230,pcVar2,pcVar2 + pbVar20->_M_string_length);
          Option::_add_result(this_00,&local_230,prVar21);
          this_00->current_option_state_ = parsing;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_230._M_dataplus._M_p != &local_230.field_2) {
            operator_delete(local_230._M_dataplus._M_p);
          }
          pbVar20 = pbVar20 + 1;
        } while (pbVar20 != local_270);
      }
      goto LAB_0012a6a6;
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_248,__x);
  prVar21 = local_290;
  this_00->current_option_state_ = parsing;
  for (; local_248.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start !=
         local_248.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
      local_248.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           local_248.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start + 1) {
    Option::_add_result(this_00,local_248.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start,prVar21);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_248);
  Option::run_callback(this_00);
LAB_0012a6a6:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_288);
  return true;
}

Assistant:

CLI11_INLINE bool App::_parse_single_config(const ConfigItem &item, std::size_t level) {

    if(level < item.parents.size()) {
        auto *subcom = get_subcommand_no_throw(item.parents.at(level));
        return (subcom != nullptr) ? subcom->_parse_single_config(item, level + 1) : false;
    }
    // check for section open
    if(item.name == "++") {
        if(configurable_) {
            increment_parsed();
            _trigger_pre_parse(2);
            if(parent_ != nullptr) {
                parent_->parsed_subcommands_.push_back(this);
            }
        }
        return true;
    }
    // check for section close
    if(item.name == "--") {
        if(configurable_ && parse_complete_callback_) {
            _process_callbacks();
            _process_requirements();
            run_callback();
        }
        return true;
    }
    Option *op = get_option_no_throw("--" + item.name);
    if(op == nullptr) {
        if(item.name.size() == 1) {
            op = get_option_no_throw("-" + item.name);
        }
        if(op == nullptr) {
            op = get_option_no_throw(item.name);
        } else if(!op->get_configurable()) {
            auto *testop = get_option_no_throw(item.name);
            if(testop != nullptr && testop->get_configurable()) {
                op = testop;
            }
        }
    } else if(!op->get_configurable()) {
        if(item.name.size() == 1) {
            auto *testop = get_option_no_throw("-" + item.name);
            if(testop != nullptr && testop->get_configurable()) {
                op = testop;
            }
        }
        if(!op->get_configurable()) {
            auto *testop = get_option_no_throw(item.name);
            if(testop != nullptr && testop->get_configurable()) {
                op = testop;
            }
        }
    }

    if(op == nullptr) {
        // If the option was not present
        if(get_allow_config_extras() == config_extras_mode::capture) {
            // Should we worry about classifying the extras properly?
            missing_.emplace_back(detail::Classifier::NONE, item.fullname());
            for(const auto &input : item.inputs) {
                missing_.emplace_back(detail::Classifier::NONE, input);
            }
        }
        return false;
    }

    if(!op->get_configurable()) {
        if(get_allow_config_extras() == config_extras_mode::ignore_all) {
            return false;
        }
        throw ConfigError::NotConfigurable(item.fullname());
    }
    if(op->empty()) {
        std::vector<std::string> buffer;  // a buffer to use for copying an modifying inputs in a few cases
        bool useBuffer{false};
        if(item.multiline) {
            if(!op->get_inject_separator()) {
                buffer = item.inputs;
                buffer.erase(std::remove(buffer.begin(), buffer.end(), "%%"), buffer.end());
                useBuffer = true;
            }
        }
        const std::vector<std::string> &inputs = (useBuffer) ? buffer : item.inputs;
        if(op->get_expected_min() == 0) {
            if(item.inputs.size() <= 1) {
                // Flag parsing
                auto res = config_formatter_->to_flag(item);
                bool converted{false};
                if(op->get_disable_flag_override()) {
                    auto val = detail::to_flag_value(res);
                    if(val == 1) {
                        res = op->get_flag_value(item.name, "{}");
                        converted = true;
                    }
                }

                if(!converted) {
                    errno = 0;
                    if(res != "{}" || op->get_expected_max() <= 1) {
                        res = op->get_flag_value(item.name, res);
                    }
                }

                op->add_result(res);
                return true;
            }
            if(static_cast<int>(inputs.size()) > op->get_items_expected_max() &&
               op->get_multi_option_policy() != MultiOptionPolicy::TakeAll) {
                if(op->get_items_expected_max() > 1) {
                    throw ArgumentMismatch::AtMost(item.fullname(), op->get_items_expected_max(), inputs.size());
                }

                if(!op->get_disable_flag_override()) {
                    throw ConversionError::TooManyInputsFlag(item.fullname());
                }
                // if the disable flag override is set then we must have the flag values match a known flag value
                // this is true regardless of the output value, so an array input is possible and must be accounted for
                for(const auto &res : inputs) {
                    bool valid_value{false};
                    if(op->default_flag_values_.empty()) {
                        if(res == "true" || res == "false" || res == "1" || res == "0") {
                            valid_value = true;
                        }
                    } else {
                        for(const auto &valid_res : op->default_flag_values_) {
                            if(valid_res.second == res) {
                                valid_value = true;
                                break;
                            }
                        }
                    }

                    if(valid_value) {
                        op->add_result(res);
                    } else {
                        throw InvalidError("invalid flag argument given");
                    }
                }
                return true;
            }
        }
        op->add_result(inputs);
        op->run_callback();
    }

    return true;
}